

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pager_end_transaction(Pager *pPager,int hasSuper,int bCommit)

{
  long lVar1;
  int iVar2;
  int in_EDX;
  int in_ESI;
  Bitvec *in_RDI;
  int bDelete;
  int rc2;
  int rc;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  Bitvec *in_stack_ffffffffffffffd0;
  undefined3 uVar3;
  undefined4 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  int iVar4;
  int local_4;
  
  local_4 = 0;
  iVar4 = 0;
  if (((in_RDI->u).aBitmap[5] < 2) && ((in_RDI->u).aBitmap[6] < 2)) {
    local_4 = 0;
  }
  else {
    releaseAllSavepoints((Pager *)in_stack_ffffffffffffffd0);
    lVar1._0_4_ = (in_RDI->u).apSub[8]->iSize;
    lVar1._4_4_ = (in_RDI->u).apSub[8]->nSet;
    if (lVar1 != 0) {
      iVar2 = sqlite3JournalIsInMemory((sqlite3_file *)(in_RDI->u).apSub[8]);
      if (iVar2 == 0) {
        if (*(char *)((long)&in_RDI->iDivisor + 1) == '\x03') {
          if ((in_RDI->u).apSub[10] == (Bitvec *)0x0) {
            local_4 = 0;
          }
          else {
            local_4 = sqlite3OsTruncate((sqlite3_file *)in_stack_ffffffffffffffd0,
                                        CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8
                                                ));
            if ((local_4 == 0) && (in_RDI->field_0xc != '\0')) {
              local_4 = sqlite3OsSync((sqlite3_file *)in_stack_ffffffffffffffd0,
                                      in_stack_ffffffffffffffcc);
            }
          }
          (in_RDI->u).apSub[10] = (Bitvec *)0x0;
        }
        else if ((*(char *)((long)&in_RDI->iDivisor + 1) == '\x01') ||
                (((char)in_RDI->iDivisor != '\0' && (*(byte *)((long)&in_RDI->iDivisor + 1) < 5))))
        {
          uVar3 = (undefined3)in_stack_ffffffffffffffd8;
          in_stack_ffffffffffffffd8 = CONCAT13(1,uVar3);
          if (in_ESI == 0) {
            in_stack_ffffffffffffffd8 = CONCAT13((in_RDI->u).aBitmap[0] != '\0',uVar3);
          }
          in_stack_ffffffffffffffd0 = in_RDI;
          local_4 = zeroJournalHdr((Pager *)CONCAT44(local_4,iVar4),in_stack_ffffffffffffffdc);
          (in_RDI->u).apSub[10] = (Bitvec *)0x0;
        }
        else {
          in_stack_ffffffffffffffdc = (uint)(((in_RDI->u).aBitmap[0] != '\0' ^ 0xffU) & 1);
          sqlite3OsClose((sqlite3_file *)0x1629ba);
          if (in_stack_ffffffffffffffdc != 0) {
            local_4 = sqlite3OsDelete((sqlite3_vfs *)in_stack_ffffffffffffffd0,
                                      (char *)CONCAT44(in_stack_ffffffffffffffcc,
                                                       in_stack_ffffffffffffffc8),0);
          }
        }
      }
      else {
        sqlite3OsClose((sqlite3_file *)0x162898);
      }
    }
    sqlite3BitvecDestroy(in_stack_ffffffffffffffd0);
    (in_RDI->u).apSub[6] = (Bitvec *)0x0;
    (in_RDI->u).aHash[9] = 0;
    if (local_4 == 0) {
      if (((in_RDI->u).aBitmap[3] == '\0') &&
         (iVar2 = pagerFlushOnCommit((Pager *)CONCAT44(in_stack_ffffffffffffffcc,
                                                       in_stack_ffffffffffffffc8),0), iVar2 == 0)) {
        sqlite3PcacheClearWritable((PCache *)(in_RDI->u).apSub[0x22]);
      }
      else {
        sqlite3PcacheCleanAll((PCache *)in_stack_ffffffffffffffd0);
      }
      sqlite3PcacheTruncate((PCache *)CONCAT44(local_4,iVar4),in_stack_ffffffffffffffdc);
    }
    if ((in_RDI->u).apSub[0x23] == (Bitvec *)0x0) {
      if (((local_4 == 0) && (in_EDX != 0)) && ((in_RDI->u).aHash[4] < (in_RDI->u).aHash[6])) {
        local_4 = pager_truncate((Pager *)CONCAT44(in_ESI,in_EDX),0);
      }
    }
    else {
      iVar4 = sqlite3WalEndWriteTransaction((Wal *)0x162a9b);
    }
    if (((local_4 == 0) && (in_EDX != 0)) &&
       (local_4 = sqlite3OsFileControl
                            ((sqlite3_file *)
                             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                             (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                             (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)),
       local_4 == 0xc)) {
      local_4 = 0;
    }
    if (((char)in_RDI->iDivisor == '\0') &&
       (((in_RDI->u).apSub[0x23] == (Bitvec *)0x0 ||
        (iVar2 = sqlite3WalExclusiveMode((Wal *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc)
        , iVar2 != 0)))) {
      iVar4 = pagerUnlockDb((Pager *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    }
    (in_RDI->u).aBitmap[5] = '\x01';
    (in_RDI->u).aBitmap[8] = '\0';
    if (local_4 == 0) {
      local_4 = iVar4;
    }
  }
  return local_4;
}

Assistant:

static int pager_end_transaction(Pager *pPager, int hasSuper, int bCommit){
  int rc = SQLITE_OK;      /* Error code from journal finalization operation */
  int rc2 = SQLITE_OK;     /* Error code from db file unlock operation */

  /* Do nothing if the pager does not have an open write transaction
  ** or at least a RESERVED lock. This function may be called when there
  ** is no write-transaction active but a RESERVED or greater lock is
  ** held under two circumstances:
  **
  **   1. After a successful hot-journal rollback, it is called with
  **      eState==PAGER_NONE and eLock==EXCLUSIVE_LOCK.
  **
  **   2. If a connection with locking_mode=exclusive holding an EXCLUSIVE
  **      lock switches back to locking_mode=normal and then executes a
  **      read-transaction, this function is called with eState==PAGER_READER
  **      and eLock==EXCLUSIVE_LOCK when the read-transaction is closed.
  */
  assert( assert_pager_state(pPager) );
  assert( pPager->eState!=PAGER_ERROR );
  if( pPager->eState<PAGER_WRITER_LOCKED && pPager->eLock<RESERVED_LOCK ){
    return SQLITE_OK;
  }

  releaseAllSavepoints(pPager);
  assert( isOpen(pPager->jfd) || pPager->pInJournal==0
      || (sqlite3OsDeviceCharacteristics(pPager->fd)&SQLITE_IOCAP_BATCH_ATOMIC)
  );
  if( isOpen(pPager->jfd) ){
    assert( !pagerUseWal(pPager) );

    /* Finalize the journal file. */
    if( sqlite3JournalIsInMemory(pPager->jfd) ){
      /* assert( pPager->journalMode==PAGER_JOURNALMODE_MEMORY ); */
      sqlite3OsClose(pPager->jfd);
    }else if( pPager->journalMode==PAGER_JOURNALMODE_TRUNCATE ){
      if( pPager->journalOff==0 ){
        rc = SQLITE_OK;
      }else{
        rc = sqlite3OsTruncate(pPager->jfd, 0);
        if( rc==SQLITE_OK && pPager->fullSync ){
          /* Make sure the new file size is written into the inode right away.
          ** Otherwise the journal might resurrect following a power loss and
          ** cause the last transaction to roll back.  See
          ** https://bugzilla.mozilla.org/show_bug.cgi?id=1072773
          */
          rc = sqlite3OsSync(pPager->jfd, pPager->syncFlags);
        }
      }
      pPager->journalOff = 0;
    }else if( pPager->journalMode==PAGER_JOURNALMODE_PERSIST
      || (pPager->exclusiveMode && pPager->journalMode<PAGER_JOURNALMODE_WAL)
    ){
      rc = zeroJournalHdr(pPager, hasSuper||pPager->tempFile);
      pPager->journalOff = 0;
    }else{
      /* This branch may be executed with Pager.journalMode==MEMORY if
      ** a hot-journal was just rolled back. In this case the journal
      ** file should be closed and deleted. If this connection writes to
      ** the database file, it will do so using an in-memory journal.
      */
      int bDelete = !pPager->tempFile;
      assert( sqlite3JournalIsInMemory(pPager->jfd)==0 );
      assert( pPager->journalMode==PAGER_JOURNALMODE_DELETE
           || pPager->journalMode==PAGER_JOURNALMODE_MEMORY
           || pPager->journalMode==PAGER_JOURNALMODE_WAL
      );
      sqlite3OsClose(pPager->jfd);
      if( bDelete ){
        rc = sqlite3OsDelete(pPager->pVfs, pPager->zJournal, pPager->extraSync);
      }
    }
  }

#ifdef SQLITE_CHECK_PAGES
  sqlite3PcacheIterateDirty(pPager->pPCache, pager_set_pagehash);
  if( pPager->dbSize==0 && sqlite3PcacheRefCount(pPager->pPCache)>0 ){
    PgHdr *p = sqlite3PagerLookup(pPager, 1);
    if( p ){
      p->pageHash = 0;
      sqlite3PagerUnrefNotNull(p);
    }
  }
#endif

  sqlite3BitvecDestroy(pPager->pInJournal);
  pPager->pInJournal = 0;
  pPager->nRec = 0;
  if( rc==SQLITE_OK ){
    if( MEMDB || pagerFlushOnCommit(pPager, bCommit) ){
      sqlite3PcacheCleanAll(pPager->pPCache);
    }else{
      sqlite3PcacheClearWritable(pPager->pPCache);
    }
    sqlite3PcacheTruncate(pPager->pPCache, pPager->dbSize);
  }

  if( pagerUseWal(pPager) ){
    /* Drop the WAL write-lock, if any. Also, if the connection was in
    ** locking_mode=exclusive mode but is no longer, drop the EXCLUSIVE
    ** lock held on the database file.
    */
    rc2 = sqlite3WalEndWriteTransaction(pPager->pWal);
    assert( rc2==SQLITE_OK );
  }else if( rc==SQLITE_OK && bCommit && pPager->dbFileSize>pPager->dbSize ){
    /* This branch is taken when committing a transaction in rollback-journal
    ** mode if the database file on disk is larger than the database image.
    ** At this point the journal has been finalized and the transaction
    ** successfully committed, but the EXCLUSIVE lock is still held on the
    ** file. So it is safe to truncate the database file to its minimum
    ** required size.  */
    assert( pPager->eLock==EXCLUSIVE_LOCK );
    rc = pager_truncate(pPager, pPager->dbSize);
  }

  if( rc==SQLITE_OK && bCommit ){
    rc = sqlite3OsFileControl(pPager->fd, SQLITE_FCNTL_COMMIT_PHASETWO, 0);
    if( rc==SQLITE_NOTFOUND ) rc = SQLITE_OK;
  }

  if( !pPager->exclusiveMode
   && (!pagerUseWal(pPager) || sqlite3WalExclusiveMode(pPager->pWal, 0))
  ){
    rc2 = pagerUnlockDb(pPager, SHARED_LOCK);
  }
  pPager->eState = PAGER_READER;
  pPager->setSuper = 0;

  return (rc==SQLITE_OK?rc2:rc);
}